

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O0

_Bool ransac_internal(Correspondence *matched_points,int npoints,MotionModel *motion_models,
                     int num_desired_motions,RansacModelInfo *model_info,_Bool *mem_alloc_failed)

{
  bool bVar1;
  _Bool _Var2;
  void *pvVar3;
  ulong uVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 *in_R8;
  undefined1 *in_R9;
  double dVar5;
  Correspondence *corr;
  int index;
  int j;
  int *tmp_1;
  int num_inliers;
  int refine_count;
  _Bool bad_model;
  int *tmp;
  int trial_count;
  int *inlier_buffer;
  int min_inliers;
  double params_this_motion [6];
  RANSAC_MOTION current_motion;
  RANSAC_MOTION *worst_kept_motion;
  RANSAC_MOTION *motions;
  int indices [4];
  uint seed;
  _Bool ret_val;
  int minpts;
  int i;
  undefined4 in_stack_fffffffffffffef8;
  int iVar6;
  RANSAC_MOTION *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar7;
  undefined8 in_stack_ffffffffffffff10;
  int local_e0;
  int local_cc;
  undefined1 local_b8 [56];
  int local_80 [2];
  undefined8 local_78;
  void *local_70;
  int *local_68;
  int *local_60;
  undefined1 local_58 [23];
  byte local_41;
  int local_40;
  int local_3c;
  undefined1 *local_38;
  undefined8 *local_30;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  _Bool local_1;
  
  local_3c = 0;
  local_40 = *(int *)(in_R8 + 2);
  local_41 = 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_58,0,0x10);
  local_68 = (int *)0x0;
  for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
    memcpy((void *)(local_20 + (long)local_3c * 0x40),kIdentityParams,0x30);
    *(undefined4 *)(local_20 + (long)local_3c * 0x40 + 0x38) = 0;
  }
  if ((SBORROW4(local_14,local_40 * 5) == local_14 + local_40 * -5 < 0) && (local_14 != 0)) {
    iVar7 = local_40;
    if (local_40 < (int)((double)local_14 * 0.1)) {
      iVar7 = (int)((double)local_14 * 0.1);
    }
    iVar6 = iVar7;
    local_60 = (int *)aom_calloc(CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                 (size_t)in_stack_ffffffffffffff00);
    pvVar3 = aom_malloc(0x3c1fb5);
    if ((local_60 == (int *)0x0) || (pvVar3 == (void *)0x0)) {
      local_41 = 0;
      *local_38 = 1;
    }
    else {
      local_68 = local_60;
      for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
        *(void **)(local_60 + (long)local_3c * 6 + 4) =
             (void *)((long)pvVar3 + (long)(local_3c * local_14) * 4);
      }
      memset(local_80,0,0x18);
      local_70 = (void *)((long)pvVar3 + (long)(local_24 * local_14) * 4);
      for (local_cc = 0; local_cc < 0x14; local_cc = local_cc + 1) {
        lcg_pick((int)((ulong)in_stack_ffffffffffffff10 >> 0x20),(int)in_stack_ffffffffffffff10,
                 (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (uint *)in_stack_ffffffffffffff00);
        uVar4 = (*(code *)*local_30)(local_10,local_58,local_40,local_b8);
        if ((((uVar4 & 1) != 0) &&
            ((*(code *)local_30[1])(local_b8,local_10,local_14,local_80), iVar7 <= local_80[0])) &&
           (_Var2 = is_better_motion(in_stack_ffffffffffffff00,
                                     (RANSAC_MOTION *)CONCAT44(iVar6,in_stack_fffffffffffffef8)),
           _Var2)) {
          *local_68 = local_80[0];
          *(undefined8 *)(local_68 + 2) = local_78;
          pvVar3 = *(void **)(local_68 + 4);
          *(void **)(local_68 + 4) = local_70;
          local_70 = pvVar3;
          for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
            _Var2 = is_better_motion(in_stack_ffffffffffffff00,
                                     (RANSAC_MOTION *)CONCAT44(iVar6,in_stack_fffffffffffffef8));
            if (_Var2) {
              local_68 = local_60 + (long)local_3c * 6;
            }
          }
        }
      }
      qsort(local_60,(long)local_24,0x18,compare_motions);
      for (local_3c = 0; local_3c < local_24; local_3c = local_3c + 1) {
        if (0 < local_60[(long)local_3c * 6]) {
          bVar1 = false;
          for (local_e0 = 0; local_e0 < 5; local_e0 = local_e0 + 1) {
            uVar4 = (*(code *)*local_30)
                              (local_10,*(undefined8 *)(local_60 + (long)local_3c * 6 + 4),
                               local_60[(long)local_3c * 6],local_b8);
            if ((uVar4 & 1) == 0) {
              bVar1 = true;
              break;
            }
            (*(code *)local_30[1])(local_b8,local_10,local_14,local_80);
            if (local_80[0] <= local_60[(long)local_3c * 6]) break;
            local_60[(long)local_3c * 6] = local_80[0];
            *(undefined8 *)(local_60 + (long)local_3c * 6 + 2) = local_78;
            pvVar3 = *(void **)(local_60 + (long)local_3c * 6 + 4);
            *(void **)(local_60 + (long)local_3c * 6 + 4) = local_70;
            local_70 = pvVar3;
          }
          if (!bVar1) {
            memcpy((void *)(local_20 + (long)local_3c * 0x40),local_b8,0x30);
            for (iVar7 = 0; iVar7 < local_60[(long)local_3c * 6]; iVar7 = iVar7 + 1) {
              in_stack_ffffffffffffff00 =
                   (RANSAC_MOTION *)
                   (local_10 +
                   (long)*(int *)(*(long *)(local_60 + (long)local_3c * 6 + 4) + (long)iVar7 * 4) *
                   0x20);
              dVar5 = rint(*(double *)in_stack_ffffffffffffff00);
              *(int *)(*(long *)(local_20 + (long)local_3c * 0x40 + 0x30) + (long)(iVar7 << 1) * 4)
                   = (int)dVar5;
              dVar5 = rint(in_stack_ffffffffffffff00->sse);
              *(int *)(*(long *)(local_20 + (long)local_3c * 0x40 + 0x30) +
                      (long)(iVar7 * 2 + 1) * 4) = (int)dVar5;
            }
            *(int *)(local_20 + (long)local_3c * 0x40 + 0x38) = local_60[(long)local_3c * 6];
          }
        }
      }
    }
    aom_free(in_stack_ffffffffffffff00);
    aom_free(in_stack_ffffffffffffff00);
    local_1 = (_Bool)(local_41 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ransac_internal(const Correspondence *matched_points, int npoints,
                            MotionModel *motion_models, int num_desired_motions,
                            const RansacModelInfo *model_info,
                            bool *mem_alloc_failed) {
  assert(npoints >= 0);
  int i = 0;
  int minpts = model_info->minpts;
  bool ret_val = true;

  unsigned int seed = (unsigned int)npoints;

  int indices[MAX_MINPTS] = { 0 };

  // Store information for the num_desired_motions best transformations found
  // and the worst motion among them, as well as the motion currently under
  // consideration.
  RANSAC_MOTION *motions, *worst_kept_motion = NULL;
  RANSAC_MOTION current_motion;

  // Store the parameters and the indices of the inlier points for the motion
  // currently under consideration.
  double params_this_motion[MAX_PARAMDIM];

  // Initialize output models, as a fallback in case we can't find a model
  for (i = 0; i < num_desired_motions; i++) {
    memcpy(motion_models[i].params, kIdentityParams,
           MAX_PARAMDIM * sizeof(*(motion_models[i].params)));
    motion_models[i].num_inliers = 0;
  }

  if (npoints < minpts * MINPTS_MULTIPLIER || npoints == 0) {
    return false;
  }

  int min_inliers = AOMMAX((int)(MIN_INLIER_PROB * npoints), minpts);

  motions =
      (RANSAC_MOTION *)aom_calloc(num_desired_motions, sizeof(RANSAC_MOTION));

  // Allocate one large buffer which will be carved up to store the inlier
  // indices for the current motion plus the num_desired_motions many
  // output models
  // This allows us to keep the allocation/deallocation logic simple, without
  // having to (for example) check that `motions` is non-null before allocating
  // the inlier arrays
  int *inlier_buffer = (int *)aom_malloc(sizeof(*inlier_buffer) * npoints *
                                         (num_desired_motions + 1));

  if (!(motions && inlier_buffer)) {
    ret_val = false;
    *mem_alloc_failed = true;
    goto finish_ransac;
  }

  // Once all our allocations are known-good, we can fill in our structures
  worst_kept_motion = motions;

  for (i = 0; i < num_desired_motions; ++i) {
    motions[i].inlier_indices = inlier_buffer + i * npoints;
  }
  memset(&current_motion, 0, sizeof(current_motion));
  current_motion.inlier_indices = inlier_buffer + num_desired_motions * npoints;

  for (int trial_count = 0; trial_count < NUM_TRIALS; trial_count++) {
    lcg_pick(npoints, minpts, indices, &seed);

    if (!model_info->find_transformation(matched_points, indices, minpts,
                                         params_this_motion)) {
      continue;
    }

    model_info->score_model(params_this_motion, matched_points, npoints,
                            &current_motion);

    if (current_motion.num_inliers < min_inliers) {
      // Reject models with too few inliers
      continue;
    }

    if (is_better_motion(&current_motion, worst_kept_motion)) {
      // This motion is better than the worst currently kept motion. Remember
      // the inlier points and sse. The parameters for each kept motion
      // will be recomputed later using only the inliers.
      worst_kept_motion->num_inliers = current_motion.num_inliers;
      worst_kept_motion->sse = current_motion.sse;

      // Rather than copying the (potentially many) inlier indices from
      // current_motion.inlier_indices to worst_kept_motion->inlier_indices,
      // we can swap the underlying pointers.
      //
      // This is okay because the next time current_motion.inlier_indices
      // is used will be in the next trial, where we ignore its previous
      // contents anyway. And both arrays will be deallocated together at the
      // end of this function, so there are no lifetime issues.
      int *tmp = worst_kept_motion->inlier_indices;
      worst_kept_motion->inlier_indices = current_motion.inlier_indices;
      current_motion.inlier_indices = tmp;

      // Determine the new worst kept motion and its num_inliers and sse.
      for (i = 0; i < num_desired_motions; ++i) {
        if (is_better_motion(worst_kept_motion, &motions[i])) {
          worst_kept_motion = &motions[i];
        }
      }
    }
  }

  // Sort the motions, best first.
  qsort(motions, num_desired_motions, sizeof(RANSAC_MOTION), compare_motions);

  // Refine each of the best N models using iterative estimation.
  //
  // The idea here is loosely based on the iterative method from
  // "Locally Optimized RANSAC" by O. Chum, J. Matas and Josef Kittler:
  // https://cmp.felk.cvut.cz/ftp/articles/matas/chum-dagm03.pdf
  //
  // However, we implement a simpler version than their proposal, and simply
  // refit the model repeatedly until the number of inliers stops increasing,
  // with a cap on the number of iterations to defend against edge cases which
  // only improve very slowly.
  for (i = 0; i < num_desired_motions; ++i) {
    if (motions[i].num_inliers <= 0) {
      // Output model has already been initialized to the identity model,
      // so just skip setup
      continue;
    }

    bool bad_model = false;
    for (int refine_count = 0; refine_count < NUM_REFINES; refine_count++) {
      int num_inliers = motions[i].num_inliers;
      assert(num_inliers >= min_inliers);

      if (!model_info->find_transformation(matched_points,
                                           motions[i].inlier_indices,
                                           num_inliers, params_this_motion)) {
        // In the unlikely event that this model fitting fails, we don't have a
        // good fallback. So leave this model set to the identity model
        bad_model = true;
        break;
      }

      // Score the newly generated model
      model_info->score_model(params_this_motion, matched_points, npoints,
                              &current_motion);

      // At this point, there are three possibilities:
      // 1) If we found more inliers, keep refining.
      // 2) If we found the same number of inliers but a lower SSE, we want to
      //    keep the new model, but further refinement is unlikely to gain much.
      //    So commit to this new model
      // 3) It is possible, but very unlikely, that the new model will have
      //    fewer inliers. If it does happen, we probably just lost a few
      //    borderline inliers. So treat the same as case (2).
      if (current_motion.num_inliers > motions[i].num_inliers) {
        motions[i].num_inliers = current_motion.num_inliers;
        motions[i].sse = current_motion.sse;
        int *tmp = motions[i].inlier_indices;
        motions[i].inlier_indices = current_motion.inlier_indices;
        current_motion.inlier_indices = tmp;
      } else {
        // Refined model is no better, so stop
        // This shouldn't be significantly worse than the previous model,
        // so it's fine to use the parameters in params_this_motion.
        // This saves us from having to cache the previous iteration's params.
        break;
      }
    }

    if (bad_model) continue;

    // Fill in output struct
    memcpy(motion_models[i].params, params_this_motion,
           MAX_PARAMDIM * sizeof(*motion_models[i].params));
    for (int j = 0; j < motions[i].num_inliers; j++) {
      int index = motions[i].inlier_indices[j];
      const Correspondence *corr = &matched_points[index];
      motion_models[i].inliers[2 * j + 0] = (int)rint(corr->x);
      motion_models[i].inliers[2 * j + 1] = (int)rint(corr->y);
    }
    motion_models[i].num_inliers = motions[i].num_inliers;
  }

finish_ransac:
  aom_free(inlier_buffer);
  aom_free(motions);

  return ret_val;
}